

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

bool __thiscall google::protobuf::internal::MapFieldBase::IsMapValid(MapFieldBase *this)

{
  TaggedPtr p;
  ReflectionPayload *pRVar1;
  bool bVar2;
  
  p = (this->super_MapFieldBaseForParse).payload_._M_i;
  if ((p & 1) == 0) {
    pRVar1 = (ReflectionPayload *)0x0;
  }
  else {
    pRVar1 = ToPayload(p);
  }
  if (pRVar1 == (ReflectionPayload *)0x0) {
    bVar2 = true;
  }
  else {
    bVar2 = (pRVar1->state)._M_i != STATE_MODIFIED_REPEATED;
  }
  return bVar2;
}

Assistant:

bool MapFieldBase::IsMapValid() const {
  ConstAccess();
  // "Acquire" insures the operation after SyncRepeatedFieldWithMap won't get
  // executed before state_ is checked.
  return state() != STATE_MODIFIED_REPEATED;
}